

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::AddReloc(BinaryWriter *this,RelocType reloc_type,Index index)

{
  Index IVar1;
  uint uVar2;
  pointer this_00;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  pointer __result;
  pointer pRVar6;
  pointer pRVar7;
  long lVar8;
  _Tp_alloc_type *__alloc;
  pointer puVar9;
  pointer puVar10;
  ulong uVar11;
  Index symbol_index;
  RelocType reloc_type_local;
  pointer local_40;
  size_t offset;
  
  pRVar7 = this->current_reloc_section_;
  reloc_type_local = reloc_type;
  if ((pRVar7 == (pointer)0x0) || (pRVar7->section_index != this->section_count_)) {
    pcVar3 = GetSectionName(this->last_section_type_);
    pRVar7 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar7 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40 = (this->reloc_sections_).
                 super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar7 - (long)local_40 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar4 = ((long)pRVar7 - (long)local_40) / 0x28;
      uVar5 = 1;
      if (pRVar7 != local_40) {
        uVar5 = uVar4;
      }
      uVar11 = uVar5 + uVar4;
      if (0x333333333333332 < uVar11) {
        uVar11 = 0x333333333333333;
      }
      if (CARRY8(uVar5,uVar4)) {
        uVar11 = 0x333333333333333;
      }
      if (uVar11 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar11 * 0x28);
      }
      this_00 = local_40;
      uVar2 = this->section_count_;
      __alloc = (_Tp_alloc_type *)(ulong)uVar2;
      __result[uVar4].name = pcVar3;
      __result[uVar4].section_index = uVar2;
      __result[uVar4].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      __result[uVar4].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __result[uVar4].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar6 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(local_40,pRVar7,__result,__alloc);
      pRVar7 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(pRVar7,pRVar7,pRVar6 + 1,__alloc);
      lVar8 = (long)(this->reloc_sections_).
                    super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
      std::
      _Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                       *)this_00,(pointer)(lVar8 / 0x28),lVar8 % 0x28);
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar7;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar11;
    }
    else {
      IVar1 = this->section_count_;
      pRVar7->name = pcVar3;
      pRVar7->section_index = IVar1;
      (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pRVar7 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar7;
    }
    pRVar7 = pRVar7 + -1;
    this->current_reloc_section_ = pRVar7;
  }
  offset = this->stream_->offset_ - this->last_section_payload_offset_;
  if (reloc_type == TableNumberLEB) {
    puVar9 = (this->symtab_).tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->symtab_).tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    if (reloc_type == TypeIndexLEB) goto LAB_0011d123;
    if (reloc_type == GlobalIndexLEB) {
      puVar9 = (this->symtab_).globals_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (this->symtab_).globals_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      if (reloc_type != First) {
        if (reloc_type < (FuncIndexI32|TableIndexSLEB)) {
          pcVar3 = *(char **)(g_reloc_type_name + (ulong)reloc_type * 8);
        }
        else {
          pcVar3 = "<error_reloc_type>";
        }
        fprintf(_stderr,"warning: unsupported relocation type: %s\n",pcVar3);
        return;
      }
      puVar9 = (this->symtab_).functions_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (this->symtab_).functions_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if ((ulong)((long)puVar10 - (long)puVar9 >> 2) <= (ulong)index) {
    return;
  }
  index = puVar9[index];
LAB_0011d123:
  if (index != 0xffffffff) {
    symbol_index = index;
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)&pRVar7->relocations,
               &reloc_type_local,&offset,&symbol_index);
  }
  return;
}

Assistant:

void BinaryWriter::AddReloc(RelocType reloc_type, Index index) {
  // Add a new reloc section if needed
  if (!current_reloc_section_ ||
      current_reloc_section_->section_index != section_count_) {
    reloc_sections_.emplace_back(GetSectionName(last_section_type_),
                                 section_count_);
    current_reloc_section_ = &reloc_sections_.back();
  }

  // Add a new relocation to the curent reloc section
  size_t offset = stream_->offset() - last_section_payload_offset_;
  Index symbol_index = GetSymbolIndex(reloc_type, index);
  if (symbol_index == kInvalidIndex) {
    // The file is invalid, for example a reference to function 42 where only 10
    // functions are defined.  The user must have already passed --no-check, so
    // no extra warning here is needed.
    return;
  }
  current_reloc_section_->relocations.emplace_back(reloc_type, offset,
                                                   symbol_index);
}